

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O3

interval_t __thiscall duckdb::MakeIntervalNice(duckdb *this,interval_t interval)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  interval_t iVar5;
  
  lVar2 = interval._0_8_;
  if ((int)this < 6) {
    uVar3 = (ulong)this >> 0x20;
    iVar1 = (int)((ulong)this >> 0x20);
    if (iVar1 < 5 && (int)this < 1) {
      if (lVar2 < 21600000000 && iVar1 < 1) {
        if (lVar2 < 3600000000) {
          if (lVar2 < 600000000) {
            if (lVar2 < 60000000) {
              if (lVar2 < 10000000) goto LAB_0066ca69;
              uVar4 = lVar2 + 500000;
              iVar1 = (int)((uVar4 & 0xffffffff) / 1000000) * 1000000;
            }
            else {
              uVar4 = lVar2 + 7500000;
              iVar1 = (int)((uVar4 >> 6 & 0x3ffffff) / 0x39387) * 15000000;
            }
          }
          else {
            uVar4 = lVar2 + 30000000;
            iVar1 = (int)((uVar4 >> 8 & 0xffffff) / 0x39387) * 60000000;
          }
          lVar2 = uVar4 - (uint)((int)uVar4 - iVar1);
        }
        else {
          lVar2 = ((lVar2 + 450000000U) / 900000000) * 900000000;
        }
      }
      else {
        lVar2 = SUB168(SEXT816(lVar2 + 1800000000) * SEXT816(-0x674a40d3fc1ad63b),8) + lVar2 +
                1800000000;
        lVar2 = ((lVar2 >> 0x1f) - (lVar2 >> 0x3f)) * 3600000000;
      }
      goto LAB_0066ca69;
    }
  }
  else {
    uVar3 = 0;
  }
  lVar2 = 0;
LAB_0066ca69:
  iVar5._0_8_ = (ulong)this & 0xffffffff | uVar3 << 0x20;
  iVar5.micros = lVar2;
  return iVar5;
}

Assistant:

interval_t MakeIntervalNice(interval_t interval) {
	if (interval.months >= 6) {
		// if we have more than 6 months, we don't care about days
		interval.days = 0;
		interval.micros = 0;
	} else if (interval.months > 0 || interval.days >= 5) {
		// if we have any months or more than 5 days, we don't care about micros
		interval.micros = 0;
	} else if (interval.days > 0 || interval.micros >= 6 * Interval::MICROS_PER_HOUR) {
		// if we any days or more than 6 hours, we want micros to be roundable by hours at least
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_HOUR);
	} else if (interval.micros >= Interval::MICROS_PER_HOUR) {
		// if we have more than an hour, we want micros to be divisible by quarter hours
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_MINUTE * 15);
	} else if (interval.micros >= Interval::MICROS_PER_MINUTE * 10) {
		// if we have more than 10 minutes, we want micros to be divisible by minutes
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_MINUTE);
	} else if (interval.micros >= Interval::MICROS_PER_MINUTE) {
		// if we have more than a minute, we want micros to be divisible by quarter minutes
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_SEC * 15);
	} else if (interval.micros >= Interval::MICROS_PER_SEC * 10) {
		// if we have more than 10 seconds, we want micros to be divisible by seconds
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_SEC);
	}
	return interval;
}